

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

Value * __thiscall
GlobOptBlockData::FindFuturePropertyValue(GlobOptBlockData *this,PropertySym *propertySym)

{
  OpCode OVar1;
  Sym *this_00;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  Opnd *this_01;
  RegOpnd *pRVar5;
  SymOpnd *pSVar6;
  ScriptContext *pSVar7;
  ThreadContext *this_02;
  PropertySym *pPVar8;
  StackSym *pSVar9;
  PropertySym *propertyCopyPropSym;
  StackSym *objectCopyPropSym;
  Sym *objectTransferSrcSym;
  Opnd *objectTransferSrc;
  Value *objectValue;
  StackSym *objectSym;
  Value *value;
  PropertySym *propertySym_local;
  GlobOptBlockData *this_local;
  
  if (propertySym == (PropertySym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x54a,"(propertySym)","propertySym");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_local = (GlobOptBlockData *)FindValue(this,&propertySym->super_Sym);
  if (this_local == (GlobOptBlockData *)0x0) {
    sourceContextId = Func::GetSourceContextId(this->globOpt->func);
    functionId = Func::GetLocalFunctionId(this->globOpt->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,CopyPropPhase,sourceContextId,functionId);
    if (bVar3) {
      this_local = (GlobOptBlockData *)0x0;
    }
    else {
      pSVar9 = propertySym->m_stackSym;
      objectTransferSrc = (Opnd *)FindValue(this,&pSVar9->super_Sym);
      if (objectTransferSrc == (Opnd *)0x0) {
        bVar3 = StackSym::IsSingleDef(pSVar9);
        if (!bVar3) {
          return (Value *)0x0;
        }
        OVar1 = ((pSVar9->field_5).m_instrDef)->m_opcode;
        if (((OVar1 != Ld_A) && (OVar1 != LdSlot)) && (OVar1 != LdSlotArr)) {
          return (Value *)0x0;
        }
        this_01 = IR::Instr::GetSrc1((pSVar9->field_5).m_instrDef);
        if (this_01 == (Opnd *)0x0) {
          return (Value *)0x0;
        }
        bVar3 = IR::Opnd::IsRegOpnd(this_01);
        if (bVar3) {
          pRVar5 = IR::Opnd::AsRegOpnd(this_01);
          objectTransferSrc = (Opnd *)FindValue(this,&pRVar5->m_sym->super_Sym);
        }
        else {
          bVar3 = IR::Opnd::IsSymOpnd(this_01);
          if (!bVar3) {
            return (Value *)0x0;
          }
          pSVar6 = IR::Opnd::AsSymOpnd(this_01);
          this_00 = pSVar6->m_sym;
          bVar3 = Sym::IsStackSym(this_00);
          if (bVar3) {
            objectTransferSrc = (Opnd *)FindValue(this,this_00);
          }
          else {
            bVar3 = Func::IsBackgroundJIT(this->globOpt->func);
            if (!bVar3) {
              pSVar7 = Func::GetScriptContext(this->globOpt->func);
              this_02 = Js::ScriptContext::GetThreadContext(pSVar7);
              pSVar7 = Func::GetScriptContext(this->globOpt->func);
              ThreadContext::ProbeStackNoDispose(this_02,0xc00,pSVar7,(PVOID)0x0);
            }
            pPVar8 = Sym::AsPropertySym(this_00);
            objectTransferSrc = (Opnd *)FindFuturePropertyValue(this,pPVar8);
          }
        }
        if (objectTransferSrc == (Opnd *)0x0) {
          return (Value *)0x0;
        }
      }
      pSVar9 = GetCopyPropSym(this,(Sym *)0x0,(Value *)objectTransferSrc);
      if (pSVar9 == (StackSym *)0x0) {
        this_local = (GlobOptBlockData *)0x0;
      }
      else {
        pPVar8 = PropertySym::Find((pSVar9->super_Sym).m_id,propertySym->m_propertyId,
                                   this->globOpt->func);
        if (pPVar8 == (PropertySym *)0x0) {
          this_local = (GlobOptBlockData *)0x0;
        }
        else {
          this_local = (GlobOptBlockData *)FindValue(this,&pPVar8->super_Sym);
        }
      }
    }
  }
  return (Value *)this_local;
}

Assistant:

Value *
GlobOptBlockData::FindFuturePropertyValue(PropertySym *const propertySym)
{
    Assert(propertySym);

    // Try a direct lookup based on this sym
    Value *const value = this->FindValue(propertySym);
    if(value)
    {
        return value;
    }

    if(PHASE_OFF(Js::CopyPropPhase, this->globOpt->func))
    {
        // Need to use copy-prop info to backtrack
        return nullptr;
    }

    // Try to get the property object's value
    StackSym *const objectSym = propertySym->m_stackSym;
    Value *objectValue = this->FindValue(objectSym);
    if(!objectValue)
    {
        if(!objectSym->IsSingleDef())
        {
            return nullptr;
        }

        switch(objectSym->m_instrDef->m_opcode)
        {
        case Js::OpCode::Ld_A:
        case Js::OpCode::LdSlotArr:
        case Js::OpCode::LdSlot:
            // Allow only these op-codes for tracking the object sym's value transfer backwards. Other transfer op-codes
            // could be included here if this function is used in scenarios that need them.
            break;

        default:
            return nullptr;
        }

        // Try to get the property object's value from the src of the definition
        IR::Opnd *const objectTransferSrc = objectSym->m_instrDef->GetSrc1();
        if(!objectTransferSrc)
        {
            return nullptr;
        }
        if(objectTransferSrc->IsRegOpnd())
        {
            objectValue = this->FindValue(objectTransferSrc->AsRegOpnd()->m_sym);
        }
        else if(objectTransferSrc->IsSymOpnd())
        {
            Sym *const objectTransferSrcSym = objectTransferSrc->AsSymOpnd()->m_sym;
            if(objectTransferSrcSym->IsStackSym())
            {
                objectValue = this->FindValue(objectTransferSrcSym);
            }
            else
            {
                // About to make a recursive call, so when jitting in the foreground, probe the stack
                if(!this->globOpt->func->IsBackgroundJIT())
                {
                    PROBE_STACK_NO_DISPOSE(this->globOpt->func->GetScriptContext(), Js::Constants::MinStackDefault);
                }
                objectValue = FindFuturePropertyValue(objectTransferSrcSym->AsPropertySym());
            }
        }
        else
        {
            return nullptr;
        }
        if(!objectValue)
        {
            return nullptr;
        }
    }

    // Try to use the property object's copy-prop sym and the property ID to find a mapped property sym, and get its value
    StackSym *const objectCopyPropSym = this->GetCopyPropSym(nullptr, objectValue);
    if(!objectCopyPropSym)
    {
        return nullptr;
    }
    PropertySym *const propertyCopyPropSym = PropertySym::Find(objectCopyPropSym->m_id, propertySym->m_propertyId, this->globOpt->func);
    if(!propertyCopyPropSym)
    {
        return nullptr;
    }
    return this->FindValue(propertyCopyPropSym);
}